

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

void path_remove(path_state_t *state)

{
  list_node_t *plVar1;
  
  plVar1 = (state->path_list).tail;
  free(plVar1->data);
  list_del(&state->path_list,plVar1);
  if ((state->path_list).head != (list_node_t *)0x0) {
    return;
  }
  path_remove_cold_1();
  for (plVar1 = (state->path_list).head; plVar1 != (list_node_t *)0x0; plVar1 = plVar1->next) {
    free(plVar1->data);
  }
  list_free_nodes(&state->path_list);
  return;
}

Assistant:

void
path_remove(
    path_state_t* state)
{
    list_node_t* node = state->path_list.tail;
    free(node->data);
    list_del(&state->path_list, node);
    if (state->path_list.head == NULL) {
        fprintf(stderr, "%s: removed last element from path\n", state->program_name);
        exit(1);
    }
}